

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

Am_Wrapper * compute_feedback_obj_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *this;
  Am_Wrapper *pAVar2;
  Am_Object local_18;
  Am_Object which_feedback;
  Am_Object *self_local;
  
  which_feedback.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_18);
  this = (Am_Value *)Am_Object::Get((ushort)which_feedback.data,0xdb);
  bVar1 = Am_Value::operator_cast_to_bool(this);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"&-&&- Recompute formula; using LINE feedback\n");
    Am_Object::operator=(&local_18,(Am_Object *)&lfeedback);
  }
  else {
    std::operator<<((ostream *)&std::cout,"&-&&- Recompute formula; using RECT feedback\n");
    Am_Object::operator=(&local_18,(Am_Object *)&rfeedback);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::~Am_Object(&local_18);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(compute_feedback_obj)
{
  Am_Object which_feedback;
  if ((bool)self.Get(Am_AS_LINE)) {
    std::cout << "&-&&- Recompute formula; using LINE feedback\n";
    which_feedback = lfeedback;
  } else {
    std::cout << "&-&&- Recompute formula; using RECT feedback\n";
    which_feedback = rfeedback;
  }
  return which_feedback;
}